

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_def.c
# Opt level: O1

int count_exts_in_msg(google_protobuf_DescriptorProto *msg_proto)

{
  anon_union_8_2_9eb4e620_for_upb_Message_0 aVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((anon_union_8_2_9eb4e620_for_upb_Message_0)
      ((anon_union_8_2_9eb4e620_for_upb_Message_0 *)(msg_proto + 8))->internal_opaque ==
      (anon_union_8_2_9eb4e620_for_upb_Message_0)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = *(int *)(((anon_union_8_2_9eb4e620_for_upb_Message_0 *)(msg_proto + 8))->internal_opaque
                    + 8);
  }
  aVar1 = (anon_union_8_2_9eb4e620_for_upb_Message_0)
          ((anon_union_8_2_9eb4e620_for_upb_Message_0 *)(msg_proto + 5))->internal_opaque;
  if (aVar1 == (anon_union_8_2_9eb4e620_for_upb_Message_0)0x0) {
    uVar5 = 0;
    uVar6 = 0;
  }
  else {
    uVar5 = *(ulong *)(aVar1.internal_opaque + 8);
    uVar6 = *(ulong *)aVar1 & 0xfffffffffffffff8;
  }
  if (uVar5 != 0) {
    uVar4 = 0;
    do {
      iVar2 = count_exts_in_msg(*(google_protobuf_DescriptorProto **)(uVar6 + uVar4 * 8));
      iVar3 = iVar3 + iVar2;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  return iVar3;
}

Assistant:

static int count_exts_in_msg(const UPB_DESC(DescriptorProto) * msg_proto) {
  size_t n;
  UPB_DESC(DescriptorProto_extension)(msg_proto, &n);
  int ext_count = n;

  const UPB_DESC(DescriptorProto)* const* nested_msgs =
      UPB_DESC(DescriptorProto_nested_type)(msg_proto, &n);
  for (size_t i = 0; i < n; i++) {
    ext_count += count_exts_in_msg(nested_msgs[i]);
  }

  return ext_count;
}